

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void * absl::base_internal::DoAllocWithArena(size_t request,Arena *arena)

{
  AllocList *head;
  long *plVar1;
  uint uVar2;
  size_t sVar3;
  AllocList *e;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong *puVar7;
  uint *puVar8;
  AllocList *pAVar9;
  ulong uVar10;
  ulong uVar11;
  ArenaLock section;
  AllocList *prev [30];
  ArenaLock local_1b8;
  AllocList *local_128 [31];
  
  if (request == 0) {
    return (void *)0x0;
  }
  anon_unknown_0::ArenaLock::ArenaLock(&local_1b8,arena);
  if (0xffffffffffffffdf < request) {
    raw_logging_internal::RawLog(kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a")
    ;
  }
  sVar3 = arena->round_up;
  uVar10 = request + sVar3 + 0x1f;
  if (uVar10 < request + 0x20) {
    raw_logging_internal::RawLog(kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a")
    ;
  }
  uVar10 = uVar10 & -sVar3;
  head = &arena->freelist;
  do {
    iVar5 = LLA_SkiplistLevels(uVar10,arena->min_size,(uint32_t *)0x0);
    if (iVar5 <= (arena->freelist).levels) {
      pAVar9 = head;
      while( true ) {
        if (pAVar9->levels < iVar5) {
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1c6,"Check %s failed: %s","i < prev->levels");
        }
        e = pAVar9->next[iVar5 + -1];
        if (e == (AllocList *)0x0) break;
        if (((e->header).magic ^ (ulong)e) != 0xffffffffb37cc16a) {
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cb,"Check %s failed: %s",
                     "next->header.magic == Magic(kMagicUnallocated, &next->header)");
        }
        if ((e->header).arena != arena) {
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cc,"Check %s failed: %s",
                     "next->header.arena == arena");
        }
        if (head != pAVar9) {
          if (e <= pAVar9) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1ce,"Check %s failed: %s","prev < next");
          }
          if (e <= (AllocList *)((long)pAVar9->next + ((pAVar9->header).size - 0x28))) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1d1,"Check %s failed: %s",
                       "reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next)"
                      );
          }
        }
        pAVar9 = e;
        if (uVar10 <= (e->header).size) {
          LLA_SkiplistDelete(head,e,local_128);
          uVar11 = arena->min_size;
          if (CARRY8(uVar11,uVar10)) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a",
                       "LowLevelAlloc arithmetic overflow");
          }
          uVar4 = (e->header).size;
          if (uVar11 + uVar10 <= uVar4) {
            plVar1 = (long *)((long)e->next + (uVar10 - 0x28));
            *plVar1 = uVar4 - uVar10;
            plVar1[1] = (long)e->next + (uVar10 - 0x28) ^ 0x4c833e95;
            plVar1[2] = (long)arena;
            (e->header).size = uVar10;
            AddToFreelist(plVar1 + 4,arena);
          }
          (e->header).magic = (ulong)e ^ 0x4c833e95;
          if ((e->header).arena != arena) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x254,"Check %s failed: %s",
                       "s->header.arena == arena","");
          }
          arena->allocation_count = arena->allocation_count + 1;
          anon_unknown_0::ArenaLock::Leave(&local_1b8);
          anon_unknown_0::ArenaLock::~ArenaLock((ArenaLock *)(ulong)(uint)local_1b8._0_4_);
          return &e->levels;
        }
      }
    }
    LOCK();
    uVar2 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
    (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i =
         (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
    UNLOCK();
    if (7 < uVar2) {
      SpinLock::SlowUnlock(&arena->mu,uVar2);
    }
    sVar3 = arena->pagesize;
    uVar11 = (uVar10 - 1) + sVar3 * 0x10;
    if (uVar11 < uVar10) {
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x1b6,"Check %s failed: %s","sum >= a");
    }
    uVar11 = uVar11 & sVar3 * -0x10;
    if ((arena->flags & 2) == 0) {
      puVar7 = (ulong *)mmap((void *)0x0,uVar11,3,0x22,-1,0);
    }
    else {
      puVar7 = (ulong *)syscall(9,0,uVar11,3,0x22,0xffffffffffffffff,0);
    }
    if (puVar7 == (ulong *)0xffffffffffffffff) {
      puVar8 = (uint *)__errno_location();
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x23a,"mmap error: %d",(ulong)*puVar8);
    }
    uVar2 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
    if ((uVar2 & 1) == 0) {
      LOCK();
      uVar6 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
      if (uVar2 == uVar6) {
        (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i = uVar2 | 1;
        uVar6 = uVar2;
      }
      UNLOCK();
      if ((uVar6 & 1) != 0) goto LAB_001500d9;
    }
    else {
LAB_001500d9:
      SpinLock::SlowLock(&arena->mu);
    }
    *puVar7 = uVar11;
    puVar7[1] = (ulong)puVar7 ^ 0x4c833e95;
    puVar7[2] = (ulong)arena;
    AddToFreelist(puVar7 + 4,arena);
  } while( true );
}

Assistant:

static void *DoAllocWithArena(size_t request, LowLevelAlloc::Arena *arena) {
  void *result = nullptr;
  if (request != 0) {
    AllocList *s;       // will point to region that satisfies request
    ArenaLock section(arena);
    // round up with header
    size_t req_rnd = RoundUp(CheckedAdd(request, sizeof (s->header)),
                             arena->round_up);
    for (;;) {      // loop until we find a suitable region
      // find the minimum levels that a block of this size must have
      int i = LLA_SkiplistLevels(req_rnd, arena->min_size, nullptr) - 1;
      if (i < arena->freelist.levels) {   // potential blocks exist
        AllocList *before = &arena->freelist;  // predecessor of s
        while ((s = Next(i, before, arena)) != nullptr &&
               s->header.size < req_rnd) {
          before = s;
        }
        if (s != nullptr) {       // we found a region
          break;
        }
      }
      // we unlock before mmap() both because mmap() may call a callback hook,
      // and because it may be slow.
      arena->mu.Unlock();
      // mmap generous 64K chunks to decrease
      // the chances/impact of fragmentation:
      size_t new_pages_size = RoundUp(req_rnd, arena->pagesize * 16);
      void *new_pages;
#ifdef _WIN32
      new_pages = VirtualAlloc(0, new_pages_size,
                               MEM_RESERVE | MEM_COMMIT, PAGE_READWRITE);
      ABSL_RAW_CHECK(new_pages != nullptr, "VirtualAlloc failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
        new_pages = base_internal::DirectMmap(nullptr, new_pages_size,
            PROT_WRITE|PROT_READ, MAP_ANONYMOUS|MAP_PRIVATE, -1, 0);
      } else {
        new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                         MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
      }
#else
      new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                       MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if (new_pages == MAP_FAILED) {
        ABSL_RAW_LOG(FATAL, "mmap error: %d", errno);
      }

#endif  // _WIN32
      arena->mu.Lock();
      s = reinterpret_cast<AllocList *>(new_pages);
      s->header.size = new_pages_size;
      // Pretend the block is allocated; call AddToFreelist() to free it.
      s->header.magic = Magic(kMagicAllocated, &s->header);
      s->header.arena = arena;
      AddToFreelist(&s->levels, arena);  // insert new region into free list
    }
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, s, prev);    // remove from free list
    // s points to the first free region that's big enough
    if (CheckedAdd(req_rnd, arena->min_size) <= s->header.size) {
      // big enough to split
      AllocList *n = reinterpret_cast<AllocList *>
                        (req_rnd + reinterpret_cast<char *>(s));
      n->header.size = s->header.size - req_rnd;
      n->header.magic = Magic(kMagicAllocated, &n->header);
      n->header.arena = arena;
      s->header.size = req_rnd;
      AddToFreelist(&n->levels, arena);
    }
    s->header.magic = Magic(kMagicAllocated, &s->header);
    ABSL_RAW_CHECK(s->header.arena == arena, "");
    arena->allocation_count++;
    section.Leave();
    result = &s->levels;
  }
  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(result, request);
  return result;
}